

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::StoreProperty<char_const*>(cmTarget *this,string *prop,char *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  cmMakefile *pcVar2;
  _anonymous_namespace_ *p_Var3;
  char *prop_00;
  __type _Var4;
  bool bVar5;
  bool bVar6;
  TargetType TVar7;
  ostream *poVar8;
  cmake *this_00;
  cmGlobalGenerator *pcVar9;
  pointer puVar10;
  string *psVar11;
  mapped_type *this_01;
  pointer pcVar12;
  pointer pcVar13;
  undefined1 auVar14 [16];
  byte local_eb1;
  undefined1 local_d98 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d80;
  BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_d60;
  _Base_ptr local_d28;
  allocator<char> local_d19;
  string local_d18;
  allocator<char> local_cf1;
  string local_cf0;
  cmValue local_cd0;
  cmValue tmp;
  cmAlphaNum local_c98;
  string local_c68;
  allocator<char> local_c41;
  string local_c40;
  allocator<char> local_c19;
  string local_c18;
  string local_bf8;
  undefined1 local_bd8 [8];
  string reusedFrom;
  undefined1 local_bb0 [8];
  string e_6;
  string local_b88;
  pointer local_b68;
  cmTarget *reusedTarget;
  ostringstream local_b40 [8];
  ostringstream e_5;
  allocator<char> local_9c1;
  string local_9c0;
  cmValue local_9a0;
  string local_998;
  ostringstream local_978 [8];
  ostringstream e_4;
  bool local_7fa;
  allocator<char> local_7f9;
  string local_7f8;
  string_view local_7d8;
  string local_7c8;
  ostringstream local_7a8 [8];
  ostringstream e_3;
  undefined1 local_630 [8];
  cmListFileBacktrace lfbt_11;
  cmListFileBacktrace lfbt_10;
  cmListFileBacktrace lfbt_9;
  cmListFileBacktrace lfbt_8;
  cmListFileBacktrace lfbt_7;
  cmListFileBacktrace lfbt_6;
  cmListFileBacktrace lfbt_5;
  cmListFileBacktrace lfbt_4;
  cmListFileBacktrace lfbt_3;
  cmListFileBacktrace lfbt_2;
  cmListFileBacktrace lfbt_1;
  cmListFileBacktrace lfbt;
  ostringstream local_550 [8];
  ostringstream e_2;
  string local_3d8;
  ostringstream local_3b8 [8];
  ostringstream e_1;
  string local_240;
  ostringstream local_220 [8];
  ostringstream e;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  _anonymous_namespace_ *local_20;
  char *value_local;
  string *prop_local;
  cmTarget *this_local;
  
  local_20 = (_anonymous_namespace_ *)value;
  value_local = (char *)prop;
  prop_local = (string *)this;
  _Var4 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (anonymous_namespace)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_);
  if (_Var4) {
    pcVar12 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
              operator->(&this->impl);
    pcVar2 = pcVar12->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"MANUALLY_ADDED_DEPENDENCIES property is read-only\n",&local_41);
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            value_local,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (anonymous_namespace)::propNAME_abi_cxx11_);
    if (_Var4) {
      pcVar12 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                operator->(&this->impl);
      pcVar2 = pcVar12->Makefile;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"NAME property is read-only\n",&local_79);
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
    }
    else {
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              value_local,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (anonymous_namespace)::propTYPE_abi_cxx11_);
      if (_Var4) {
        pcVar12 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                  operator->(&this->impl);
        pcVar2 = pcVar12->Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"TYPE property is read-only\n",&local_a1);
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator(&local_a1);
      }
      else {
        _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )value_local,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(anonymous_namespace)::propEXPORT_NAME_abi_cxx11_);
        if ((_Var4) && (bVar6 = IsImported(this), bVar6)) {
          std::__cxx11::ostringstream::ostringstream(local_220);
          poVar8 = std::operator<<((ostream *)local_220,
                                   "EXPORT_NAME property can\'t be set on imported targets (\"");
          pcVar12 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                    operator->(&this->impl);
          poVar8 = std::operator<<(poVar8,(string *)&pcVar12->Name);
          std::operator<<(poVar8,"\")\n");
          pcVar12 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                    operator->(&this->impl);
          pcVar2 = pcVar12->Makefile;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_240);
          std::__cxx11::string::~string((string *)&local_240);
          std::__cxx11::ostringstream::~ostringstream(local_220);
        }
        else {
          _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)value_local,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(anonymous_namespace)::propSOURCES_abi_cxx11_);
          if ((_Var4) && (bVar6 = IsImported(this), bVar6)) {
            std::__cxx11::ostringstream::ostringstream(local_3b8);
            poVar8 = std::operator<<((ostream *)local_3b8,
                                     "SOURCES property can\'t be set on imported targets (\"");
            pcVar12 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                      operator->(&this->impl);
            poVar8 = std::operator<<(poVar8,(string *)&pcVar12->Name);
            std::operator<<(poVar8,"\")\n");
            pcVar12 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                      operator->(&this->impl);
            pcVar2 = pcVar12->Makefile;
            std::__cxx11::ostringstream::str();
            cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_3d8);
            std::__cxx11::string::~string((string *)&local_3d8);
            std::__cxx11::ostringstream::~ostringstream(local_3b8);
          }
          else {
            _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)value_local,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_);
            if ((!_Var4) || (bVar6 = IsImported(this), bVar6)) {
              _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)value_local,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(anonymous_namespace)::propINCLUDE_DIRECTORIES_abi_cxx11_);
              if (_Var4) {
                pcVar12 = std::
                          unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                          operator->(&this->impl);
                std::
                vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::clear(&pcVar12->IncludeDirectoriesEntries);
                if (local_20 != (_anonymous_namespace_ *)0x0) {
                  std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                  operator->(&this->impl);
                  p_Var1 = &lfbt_1.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                            TopEntry.
                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount;
                  cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                  pcVar12 = std::
                            unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                            operator->(&this->impl);
                  std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                  emplace_back<char_const*&,cmListFileBacktrace&>
                            ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                              *)&pcVar12->IncludeDirectoriesEntries,(char **)&local_20,
                             (cmListFileBacktrace *)p_Var1);
                  cmListFileBacktrace::~cmListFileBacktrace
                            ((cmListFileBacktrace *)
                             &lfbt_1.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                              TopEntry.
                              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                }
              }
              else {
                _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)value_local,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(anonymous_namespace)::propCOMPILE_OPTIONS_abi_cxx11_);
                if (_Var4) {
                  pcVar12 = std::
                            unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                            operator->(&this->impl);
                  std::
                  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::clear(&pcVar12->CompileOptionsEntries);
                  if (local_20 != (_anonymous_namespace_ *)0x0) {
                    std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                    operator->(&this->impl);
                    p_Var1 = &lfbt_2.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                              TopEntry.
                              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount;
                    cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                    pcVar12 = std::
                              unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                              ::operator->(&this->impl);
                    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                    emplace_back<char_const*&,cmListFileBacktrace&>
                              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                *)&pcVar12->CompileOptionsEntries,(char **)&local_20,
                               (cmListFileBacktrace *)p_Var1);
                    cmListFileBacktrace::~cmListFileBacktrace
                              ((cmListFileBacktrace *)
                               &lfbt_2.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                TopEntry.
                                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
                  }
                }
                else {
                  _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)value_local,
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)(anonymous_namespace)::propCOMPILE_FEATURES_abi_cxx11_)
                  ;
                  if (_Var4) {
                    pcVar12 = std::
                              unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                              ::operator->(&this->impl);
                    std::
                    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::clear(&pcVar12->CompileFeaturesEntries);
                    if (local_20 != (_anonymous_namespace_ *)0x0) {
                      std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                      operator->(&this->impl);
                      p_Var1 = &lfbt_3.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                TopEntry.
                                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount;
                      cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                      pcVar12 = std::
                                unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ::operator->(&this->impl);
                      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                      ::emplace_back<char_const*&,cmListFileBacktrace&>
                                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                  *)&pcVar12->CompileFeaturesEntries,(char **)&local_20,
                                 (cmListFileBacktrace *)p_Var1);
                      cmListFileBacktrace::~cmListFileBacktrace
                                ((cmListFileBacktrace *)
                                 &lfbt_3.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                  TopEntry.
                                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
                    }
                  }
                  else {
                    _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)value_local,
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)(anonymous_namespace)::
                                               propCOMPILE_DEFINITIONS_abi_cxx11_);
                    if (_Var4) {
                      pcVar12 = std::
                                unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ::operator->(&this->impl);
                      std::
                      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::clear(&pcVar12->CompileDefinitionsEntries);
                      if (local_20 != (_anonymous_namespace_ *)0x0) {
                        std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                        ::operator->(&this->impl);
                        p_Var1 = &lfbt_4.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                  TopEntry.
                                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount;
                        cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                        pcVar12 = std::
                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ::operator->(&this->impl);
                        std::
                        vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
                        emplace_back<char_const*&,cmListFileBacktrace&>
                                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                    *)&pcVar12->CompileDefinitionsEntries,(char **)&local_20,
                                   (cmListFileBacktrace *)p_Var1);
                        cmListFileBacktrace::~cmListFileBacktrace
                                  ((cmListFileBacktrace *)
                                   &lfbt_4.
                                    super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                    TopEntry.
                                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
                      }
                    }
                    else {
                      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)value_local,
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)(anonymous_namespace)::propLINK_OPTIONS_abi_cxx11_)
                      ;
                      if (_Var4) {
                        pcVar12 = std::
                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ::operator->(&this->impl);
                        std::
                        vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::clear(&pcVar12->LinkOptionsEntries);
                        if (local_20 != (_anonymous_namespace_ *)0x0) {
                          std::
                          unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                          operator->(&this->impl);
                          p_Var1 = &lfbt_5.
                                    super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                    TopEntry.
                                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount;
                          cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                          pcVar12 = std::
                                    unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                    ::operator->(&this->impl);
                          std::
                          vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                          ::emplace_back<char_const*&,cmListFileBacktrace&>
                                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                      *)&pcVar12->LinkOptionsEntries,(char **)&local_20,
                                     (cmListFileBacktrace *)p_Var1);
                          cmListFileBacktrace::~cmListFileBacktrace
                                    ((cmListFileBacktrace *)
                                     &lfbt_5.
                                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                      TopEntry.
                                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
                        }
                      }
                      else {
                        _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)value_local,
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)(anonymous_namespace)::
                                                   propLINK_DIRECTORIES_abi_cxx11_);
                        if (_Var4) {
                          pcVar12 = std::
                                    unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                    ::operator->(&this->impl);
                          std::
                          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::clear(&pcVar12->LinkDirectoriesEntries);
                          if (local_20 != (_anonymous_namespace_ *)0x0) {
                            std::
                            unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::
                            operator->(&this->impl);
                            p_Var1 = &lfbt_6.
                                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                      TopEntry.
                                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount;
                            cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                            pcVar12 = std::
                                      unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                      ::operator->(&this->impl);
                            std::
                            vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                            ::emplace_back<char_const*&,cmListFileBacktrace&>
                                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                        *)&pcVar12->LinkDirectoriesEntries,(char **)&local_20,
                                       (cmListFileBacktrace *)p_Var1);
                            cmListFileBacktrace::~cmListFileBacktrace
                                      ((cmListFileBacktrace *)
                                       &lfbt_6.
                                        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                        TopEntry.
                                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
                          }
                        }
                        else {
                          _Var4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propPRECOMPILE_HEADERS_abi_cxx11_);
                          if (_Var4) {
                            pcVar12 = std::
                                      unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                      ::operator->(&this->impl);
                            std::
                            vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::clear(&pcVar12->PrecompileHeadersEntries);
                            if (local_20 != (_anonymous_namespace_ *)0x0) {
                              std::
                              unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                              ::operator->(&this->impl);
                              p_Var1 = &lfbt_7.
                                        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                        TopEntry.
                                        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount;
                              cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                              pcVar12 = std::
                                        unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                        ::operator->(&this->impl);
                              std::
                              vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                              ::emplace_back<char_const*&,cmListFileBacktrace&>
                                        ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                          *)&pcVar12->PrecompileHeadersEntries,(char **)&local_20,
                                         (cmListFileBacktrace *)p_Var1);
                              cmListFileBacktrace::~cmListFileBacktrace
                                        ((cmListFileBacktrace *)
                                         &lfbt_7.
                                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                                          .TopEntry.
                                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                            }
                          }
                          else {
                            _Var4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propLINK_LIBRARIES_abi_cxx11_);
                            if (_Var4) {
                              pcVar12 = std::
                                        unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                        ::operator->(&this->impl);
                              std::
                              vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::clear(&pcVar12->LinkImplementationPropertyEntries);
                              if (local_20 != (_anonymous_namespace_ *)0x0) {
                                std::
                                unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                ::operator->(&this->impl);
                                p_Var1 = &lfbt_8.
                                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                                          .TopEntry.
                                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount;
                                cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                                pcVar12 = std::
                                          unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                          ::operator->(&this->impl);
                                std::
                                vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                ::emplace_back<char_const*&,cmListFileBacktrace&>
                                          ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                            *)&pcVar12->LinkImplementationPropertyEntries,
                                           (char **)&local_20,(cmListFileBacktrace *)p_Var1);
                                cmListFileBacktrace::~cmListFileBacktrace
                                          ((cmListFileBacktrace *)
                                           &lfbt_8.
                                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                                            .TopEntry.
                                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount);
                              }
                            }
                            else {
                              _Var4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propINTERFACE_LINK_LIBRARIES_abi_cxx11_);
                              if (_Var4) {
                                pcVar12 = std::
                                          unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                          ::operator->(&this->impl);
                                std::
                                vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::clear(&pcVar12->LinkInterfacePropertyEntries);
                                if (local_20 != (_anonymous_namespace_ *)0x0) {
                                  std::
                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ::operator->(&this->impl);
                                  p_Var1 = &lfbt_9.
                                            super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                                            .TopEntry.
                                            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount;
                                  cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                                  pcVar12 = std::
                                            unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                            ::operator->(&this->impl);
                                  std::
                                  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                  ::emplace_back<char_const*&,cmListFileBacktrace&>
                                            ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                              *)&pcVar12->LinkInterfacePropertyEntries,
                                             (char **)&local_20,(cmListFileBacktrace *)p_Var1);
                                  cmListFileBacktrace::~cmListFileBacktrace
                                            ((cmListFileBacktrace *)
                                             &lfbt_9.
                                              super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                                              .TopEntry.
                                              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount);
                                }
                              }
                              else {
                                _Var4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_);
                                if (_Var4) {
                                  pcVar12 = std::
                                            unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                            ::operator->(&this->impl);
                                  std::
                                  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ::clear(&pcVar12->LinkInterfaceDirectPropertyEntries);
                                  if (local_20 != (_anonymous_namespace_ *)0x0) {
                                    std::
                                    unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                    ::operator->(&this->impl);
                                    p_Var1 = &lfbt_10.
                                              super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                                              .TopEntry.
                                              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount;
                                    cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                                    pcVar12 = std::
                                              unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                              ::operator->(&this->impl);
                                    std::
                                    vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                    ::emplace_back<char_const*&,cmListFileBacktrace&>
                                              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                                *)&pcVar12->LinkInterfaceDirectPropertyEntries,
                                               (char **)&local_20,(cmListFileBacktrace *)p_Var1);
                                    cmListFileBacktrace::~cmListFileBacktrace
                                              ((cmListFileBacktrace *)
                                               &lfbt_10.
                                                super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                                                .TopEntry.
                                                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount);
                                  }
                                }
                                else {
                                  _Var4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                                                                        
                                                  propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_
                                                  );
                                  if (_Var4) {
                                    pcVar12 = std::
                                              unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                              ::operator->(&this->impl);
                                    std::
                                    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::clear(&pcVar12->LinkInterfaceDirectExcludePropertyEntries);
                                    if (local_20 != (_anonymous_namespace_ *)0x0) {
                                      std::
                                      unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                      ::operator->(&this->impl);
                                      p_Var1 = &lfbt_11.
                                                super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                                                .TopEntry.
                                                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount;
                                      cmMakefile::GetBacktrace((cmMakefile *)p_Var1);
                                      pcVar12 = std::
                                                unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                ::operator->(&this->impl);
                                      std::
                                      vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                      ::emplace_back<char_const*&,cmListFileBacktrace&>
                                                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                                  *)&pcVar12->
                                                  LinkInterfaceDirectExcludePropertyEntries,
                                                 (char **)&local_20,(cmListFileBacktrace *)p_Var1);
                                      cmListFileBacktrace::~cmListFileBacktrace
                                                ((cmListFileBacktrace *)
                                                 &lfbt_11.
                                                  super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                                                  .TopEntry.
                                                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount);
                                    }
                                  }
                                  else {
                                    _Var4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::propSOURCES_abi_cxx11_);
                                    if (_Var4) {
                                      pcVar12 = std::
                                                unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                ::operator->(&this->impl);
                                      std::
                                      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      ::clear(&pcVar12->SourceEntries);
                                      if (local_20 != (_anonymous_namespace_ *)0x0) {
                                        std::
                                        unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                        ::operator->(&this->impl);
                                        cmMakefile::GetBacktrace((cmMakefile *)local_630);
                                        pcVar12 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                        std::
                                        vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                        ::emplace_back<char_const*&,cmListFileBacktrace&>
                                                  ((
                                                  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                                                  *)&pcVar12->SourceEntries,(char **)&local_20,
                                                  (cmListFileBacktrace *)local_630);
                                        cmListFileBacktrace::~cmListFileBacktrace
                                                  ((cmListFileBacktrace *)local_630);
                                      }
                                    }
                                    else {
                                      _Var4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propIMPORTED_GLOBAL_abi_cxx11_);
                                      if (_Var4) {
                                        bVar6 = cmIsOn((char *)local_20);
                                        if (bVar6) {
                                          pcVar12 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                          if ((pcVar12->ImportedGloballyVisible & 1U) == 0) {
                                            pcVar12 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                            pcVar12->ImportedGloballyVisible = true;
                                            pcVar9 = GetGlobalGenerator(this);
                                            cmGlobalGenerator::IndexTarget(pcVar9,this);
                                          }
                                        }
                                        else {
                                          std::__cxx11::ostringstream::ostringstream(local_7a8);
                                          poVar8 = std::operator<<((ostream *)local_7a8,
                                                                                                                                      
                                                  "IMPORTED_GLOBAL property can\'t be set to FALSE on targets (\""
                                                  );
                                          pcVar12 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                          poVar8 = std::operator<<(poVar8,(string *)&pcVar12->Name);
                                          std::operator<<(poVar8,"\")\n");
                                          pcVar12 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                          pcVar2 = pcVar12->Makefile;
                                          std::__cxx11::ostringstream::str();
                                          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_7c8);
                                          std::__cxx11::string::~string((string *)&local_7c8);
                                          std::__cxx11::ostringstream::~ostringstream(local_7a8);
                                        }
                                      }
                                      else {
                                        local_7d8 = (string_view)
                                                    std::__cxx11::string::
                                                    operator_cast_to_basic_string_view
                                                              ((string *)value_local);
                                        bVar5 = cmHasLiteralPrefix<17ul>
                                                          (local_7d8,
                                                           (char (*) [17])"IMPORTED_LIBNAME");
                                        local_7fa = false;
                                        bVar6 = false;
                                        local_eb1 = 0;
                                        if (bVar5) {
                                          pcVar12 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                          prop_00 = value_local;
                                          p_Var3 = local_20;
                                          local_7fa = local_20 == (_anonymous_namespace_ *)0x0;
                                          if (local_7fa) {
                                            std::__cxx11::string::string((string *)&local_7f8);
                                          }
                                          else {
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&local_7f8,(char *)p_Var3,
                                                       &local_7f9);
                                          }
                                          local_7fa = !local_7fa;
                                          bVar6 = true;
                                          bVar5 = cmTargetInternals::CheckImportedLibName
                                                            (pcVar12,(string *)prop_00,&local_7f8);
                                          local_eb1 = bVar5 ^ 0xff;
                                        }
                                        if (bVar6) {
                                          std::__cxx11::string::~string((string *)&local_7f8);
                                        }
                                        if (local_7fa) {
                                          std::allocator<char>::~allocator(&local_7f9);
                                        }
                                        if ((local_eb1 & 1) == 0) {
                                          _Var4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propCUDA_PTX_COMPILATION_abi_cxx11_);
                                          if (_Var4) {
                                            TVar7 = GetType(this);
                                            if (TVar7 != OBJECT_LIBRARY) {
                                              std::__cxx11::ostringstream::ostringstream(local_978);
                                              poVar8 = std::operator<<((ostream *)local_978,
                                                                                                                                              
                                                  "CUDA_PTX_COMPILATION property can only be applied to OBJECT targets (\""
                                                  );
                                              pcVar12 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                              poVar8 = std::operator<<(poVar8,(string *)
                                                                              &pcVar12->Name);
                                              std::operator<<(poVar8,"\")\n");
                                              pcVar12 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                              pcVar2 = pcVar12->Makefile;
                                              std::__cxx11::ostringstream::str();
                                              cmMakefile::IssueMessage
                                                        (pcVar2,FATAL_ERROR,&local_998);
                                              std::__cxx11::string::~string((string *)&local_998);
                                              std::__cxx11::ostringstream::~ostringstream(local_978)
                                              ;
                                              return;
                                            }
                                          }
                                          _Var4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propPRECOMPILE_HEADERS_REUSE_FROM_abi_cxx11_);
                                          if (_Var4) {
                                            std::allocator<char>::allocator();
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&local_9c0,"PRECOMPILE_HEADERS",
                                                       &local_9c1);
                                            local_9a0 = GetProperty(this,&local_9c0);
                                            bVar6 = cmValue::operator_cast_to_bool(&local_9a0);
                                            std::__cxx11::string::~string((string *)&local_9c0);
                                            std::allocator<char>::~allocator(&local_9c1);
                                            if (bVar6) {
                                              std::__cxx11::ostringstream::ostringstream(local_b40);
                                              poVar8 = std::operator<<((ostream *)local_b40,
                                                                                                                                              
                                                  "PRECOMPILE_HEADERS property is already set on target (\""
                                                  );
                                              pcVar12 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                              poVar8 = std::operator<<(poVar8,(string *)
                                                                              &pcVar12->Name);
                                              std::operator<<(poVar8,"\")\n");
                                              pcVar12 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                              pcVar2 = pcVar12->Makefile;
                                              std::__cxx11::ostringstream::str();
                                              cmMakefile::IssueMessage
                                                        (pcVar2,FATAL_ERROR,(string *)&reusedTarget)
                                              ;
                                              std::__cxx11::string::~string((string *)&reusedTarget)
                                              ;
                                              std::__cxx11::ostringstream::~ostringstream(local_b40)
                                              ;
                                            }
                                            else {
                                              pcVar12 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                              this_00 = cmMakefile::GetCMakeInstance
                                                                  (pcVar12->Makefile);
                                              pcVar9 = cmake::GetGlobalGenerator(this_00);
                                              p_Var3 = local_20;
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_b88,(char *)p_Var3,
                                                         (allocator<char> *)
                                                         (e_6.field_2._M_local_buf + 0xf));
                                              puVar10 = (pointer)cmGlobalGenerator::FindTarget
                                                                           (pcVar9,&local_b88,false)
                                              ;
                                              std::__cxx11::string::~string((string *)&local_b88);
                                              std::allocator<char>::~allocator
                                                        ((allocator<char> *)
                                                         (e_6.field_2._M_local_buf + 0xf));
                                              local_b68 = puVar10;
                                              if (puVar10 == (pointer)0x0) {
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)local_bb0,
                                                                                                                      
                                                  "PRECOMPILE_HEADERS_REUSE_FROM set with non existing target"
                                                  ,(allocator<char> *)
                                                   (reusedFrom.field_2._M_local_buf + 0xf));
                                                std::allocator<char>::~allocator
                                                          ((allocator<char> *)
                                                           (reusedFrom.field_2._M_local_buf + 0xf));
                                                pcVar12 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                                cmMakefile::IssueMessage
                                                          (pcVar12->Makefile,FATAL_ERROR,
                                                           (string *)local_bb0);
                                                std::__cxx11::string::~string((string *)local_bb0);
                                              }
                                              else {
                                                psVar11 = GetSafeProperty((cmTarget *)puVar10,
                                                                          (string *)value_local);
                                                std::__cxx11::string::string
                                                          ((string *)local_bd8,(string *)psVar11);
                                                auVar14 = std::__cxx11::string::empty();
                                                if ((auVar14 & (undefined1  [16])0x1) !=
                                                    (undefined1  [16])0x0) {
                                                  (anonymous_namespace)::
                                                  ConvertToString<char_const*>
                                                            (&local_bf8,local_20,auVar14._8_8_);
                                                  std::__cxx11::string::operator=
                                                            ((string *)local_bd8,
                                                             (string *)&local_bf8);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_bf8);
                                                }
                                                pcVar12 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                                cmPropertyMap::SetProperty
                                                          (&pcVar12->Properties,
                                                           (string *)value_local,(string *)local_bd8
                                                          );
                                                puVar10 = local_b68;
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&local_c18,"COMPILE_PDB_NAME",
                                                           &local_c19);
                                                SetProperty((cmTarget *)puVar10,&local_c18,
                                                            (string *)local_bd8);
                                                std::__cxx11::string::~string((string *)&local_c18);
                                                std::allocator<char>::~allocator(&local_c19);
                                                puVar10 = local_b68;
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&local_c40,
                                                           "COMPILE_PDB_OUTPUT_DIRECTORY",&local_c41
                                                          );
                                                cmAlphaNum::cmAlphaNum
                                                          (&local_c98,(string *)local_bd8);
                                                cmAlphaNum::cmAlphaNum((cmAlphaNum *)&tmp,".dir/");
                                                cmStrCat<>(&local_c68,&local_c98,(cmAlphaNum *)&tmp)
                                                ;
                                                SetProperty((cmTarget *)puVar10,&local_c40,
                                                            &local_c68);
                                                std::__cxx11::string::~string((string *)&local_c68);
                                                std::__cxx11::string::~string((string *)&local_c40);
                                                std::allocator<char>::~allocator(&local_c41);
                                                puVar10 = local_b68;
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&local_cf0,"COMPILE_PDB_NAME",
                                                           &local_cf1);
                                                local_cd0 = GetProperty((cmTarget *)puVar10,
                                                                        &local_cf0);
                                                std::__cxx11::string::~string((string *)&local_cf0);
                                                std::allocator<char>::~allocator(&local_cf1);
                                                std::allocator<char>::allocator();
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&local_d18,"COMPILE_PDB_NAME",
                                                           &local_d19);
                                                local_d28 = (_Base_ptr)local_cd0.Value;
                                                SetProperty(this,&local_d18,local_cd0);
                                                std::__cxx11::string::~string((string *)&local_d18);
                                                std::allocator<char>::~allocator(&local_d19);
                                                pcVar12 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                                AddUtility(this,(string *)local_bd8,false,
                                                           pcVar12->Makefile);
                                                std::__cxx11::string::~string((string *)local_bd8);
                                              }
                                            }
                                          }
                                          else {
                                            _Var4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::propC_STANDARD_abi_cxx11_
                                                  );
                                            if (!_Var4) {
                                              _Var4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propCXX_STANDARD_abi_cxx11_);
                                              if (!_Var4) {
                                                _Var4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propCUDA_STANDARD_abi_cxx11_);
                                                if (!_Var4) {
                                                  _Var4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propHIP_STANDARD_abi_cxx11_);
                                                  if (!_Var4) {
                                                    _Var4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propOBJC_STANDARD_abi_cxx11_);
                                                  if (!_Var4) {
                                                    _Var4 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)value_local,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)(anonymous_namespace)::
                                                    propOBJCXX_STANDARD_abi_cxx11_);
                                                  if (!_Var4) {
                                                    pcVar12 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                                  pcVar13 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::get(&this->impl);
                                                  bVar6 = (anonymous_namespace)::FileSetType::
                                                          WriteProperties<char_const*>
                                                                    ((FileSetType *)
                                                                     &pcVar12->HeadersFileSets,this,
                                                                     pcVar13,(string *)value_local,
                                                                     (char *)local_20,true);
                                                  if (bVar6) {
                                                    return;
                                                  }
                                                  pcVar12 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                                  pcVar13 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::get(&this->impl);
                                                  bVar6 = (anonymous_namespace)::FileSetType::
                                                          WriteProperties<char_const*>
                                                                    ((FileSetType *)
                                                                     &pcVar12->CxxModulesFileSets,
                                                                     this,pcVar13,
                                                                     (string *)value_local,
                                                                     (char *)local_20,true);
                                                  if (bVar6) {
                                                    return;
                                                  }
                                                  pcVar12 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                                  pcVar13 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::get(&this->impl);
                                                  bVar6 = (anonymous_namespace)::FileSetType::
                                                          WriteProperties<char_const*>
                                                                    ((FileSetType *)
                                                                     &pcVar12->
                                                  CxxModuleHeadersFileSets,this,pcVar13,
                                                  (string *)value_local,(char *)local_20,true);
                                                  if (bVar6) {
                                                    return;
                                                  }
                                                  pcVar12 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                                  cmPropertyMap::SetProperty
                                                            (&pcVar12->Properties,
                                                             (string *)value_local,(char *)local_20)
                                                  ;
                                                  return;
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                            p_Var3 = local_20;
                                            if (local_20 == (_anonymous_namespace_ *)0x0) {
                                              pcVar12 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                              std::
                                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                              ::erase(&pcVar12->LanguageStandardProperties,
                                                      (key_type *)value_local);
                                            }
                                            else {
                                              std::allocator<char>::allocator();
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&local_d80,(char *)p_Var3,
                                                         (allocator<char> *)(local_d98 + 0x17));
                                              std::
                                              unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                              ::operator->(&this->impl);
                                              cmMakefile::GetBacktrace((cmMakefile *)local_d98);
                                              BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::BTs(&local_d60,&local_d80,
                                                    (cmListFileBacktrace *)local_d98);
                                              pcVar12 = std::
                                                  unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                                  ::operator->(&this->impl);
                                              this_01 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                                  ::operator[](&pcVar12->LanguageStandardProperties,
                                                               (key_type *)value_local);
                                              BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::operator=(this_01,&local_d60);
                                              BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::~BTs(&local_d60);
                                              cmListFileBacktrace::~cmListFileBacktrace
                                                        ((cmListFileBacktrace *)local_d98);
                                              std::__cxx11::string::~string((string *)&local_d80);
                                              std::allocator<char>::~allocator
                                                        ((allocator<char> *)(local_d98 + 0x17));
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              std::__cxx11::ostringstream::ostringstream(local_550);
              poVar8 = std::operator<<((ostream *)local_550,
                                       "IMPORTED_GLOBAL property can\'t be set on non-imported targets (\""
                                      );
              pcVar12 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                        ::operator->(&this->impl);
              poVar8 = std::operator<<(poVar8,(string *)&pcVar12->Name);
              std::operator<<(poVar8,"\")\n");
              pcVar12 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                        ::operator->(&this->impl);
              pcVar2 = pcVar12->Makefile;
              std::__cxx11::ostringstream::str();
              cmMakefile::IssueMessage
                        (pcVar2,FATAL_ERROR,
                         (string *)
                         &lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
              std::__cxx11::string::~string
                        ((string *)
                         &lfbt.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
              std::__cxx11::ostringstream::~ostringstream(local_550);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cmTarget::StoreProperty(const std::string& prop, ValueType value)
{
  if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
    this->impl->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "MANUALLY_ADDED_DEPENDENCIES property is read-only\n");
    return;
  }
  if (prop == propNAME) {
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                       "NAME property is read-only\n");
    return;
  }
  if (prop == propTYPE) {
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                       "TYPE property is read-only\n");
    return;
  }
  if (prop == propEXPORT_NAME && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propSOURCES && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propIMPORTED_GLOBAL && !this->IsImported()) {
    std::ostringstream e;
    e << "IMPORTED_GLOBAL property can't be set on non-imported targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (prop == propINCLUDE_DIRECTORIES) {
    this->impl->IncludeDirectoriesEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->IncludeDirectoriesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propCOMPILE_OPTIONS) {
    this->impl->CompileOptionsEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->CompileOptionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propCOMPILE_FEATURES) {
    this->impl->CompileFeaturesEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->CompileFeaturesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propCOMPILE_DEFINITIONS) {
    this->impl->CompileDefinitionsEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->CompileDefinitionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propLINK_OPTIONS) {
    this->impl->LinkOptionsEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkOptionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propLINK_DIRECTORIES) {
    this->impl->LinkDirectoriesEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkDirectoriesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propPRECOMPILE_HEADERS) {
    this->impl->PrecompileHeadersEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->PrecompileHeadersEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propLINK_LIBRARIES) {
    this->impl->LinkImplementationPropertyEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkImplementationPropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES) {
    this->impl->LinkInterfacePropertyEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkInterfacePropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES_DIRECT) {
    this->impl->LinkInterfaceDirectPropertyEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkInterfaceDirectPropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE) {
    this->impl->LinkInterfaceDirectExcludePropertyEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkInterfaceDirectExcludePropertyEntries.emplace_back(value,
                                                                         lfbt);
    }
  } else if (prop == propSOURCES) {
    this->impl->SourceEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->SourceEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propIMPORTED_GLOBAL) {
    if (!cmIsOn(value)) {
      std::ostringstream e;
      e << "IMPORTED_GLOBAL property can't be set to FALSE on targets (\""
        << this->impl->Name << "\")\n";
      this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
    /* no need to change anything if value does not change */
    if (!this->impl->ImportedGloballyVisible) {
      this->impl->ImportedGloballyVisible = true;
      this->GetGlobalGenerator()->IndexTarget(this);
    }
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME") &&
             !this->impl->CheckImportedLibName(
               prop,
               value ? value
                     : std::string{})) { // NOLINT(bugprone-branch-clone)
    /* error was reported by check method */
  } else if (prop == propCUDA_PTX_COMPILATION &&
             this->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "CUDA_PTX_COMPILATION property can only be applied to OBJECT "
         "targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  } else if (prop == propPRECOMPILE_HEADERS_REUSE_FROM) {
    if (this->GetProperty("PRECOMPILE_HEADERS")) {
      std::ostringstream e;
      e << "PRECOMPILE_HEADERS property is already set on target (\""
        << this->impl->Name << "\")\n";
      this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
    auto* reusedTarget = this->impl->Makefile->GetCMakeInstance()
                           ->GetGlobalGenerator()
                           ->FindTarget(value);
    if (!reusedTarget) {
      const std::string e(
        "PRECOMPILE_HEADERS_REUSE_FROM set with non existing target");
      this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e);
      return;
    }

    std::string reusedFrom = reusedTarget->GetSafeProperty(prop);
    if (reusedFrom.empty()) {
      reusedFrom = ConvertToString(value);
    }

    this->impl->Properties.SetProperty(prop, reusedFrom);

    reusedTarget->SetProperty("COMPILE_PDB_NAME", reusedFrom);
    reusedTarget->SetProperty("COMPILE_PDB_OUTPUT_DIRECTORY",
                              cmStrCat(reusedFrom, ".dir/"));

    cmValue tmp = reusedTarget->GetProperty("COMPILE_PDB_NAME");
    this->SetProperty("COMPILE_PDB_NAME", tmp);
    this->AddUtility(reusedFrom, false, this->impl->Makefile);
  } else if (prop == propC_STANDARD || prop == propCXX_STANDARD ||
             prop == propCUDA_STANDARD || prop == propHIP_STANDARD ||
             prop == propOBJC_STANDARD || prop == propOBJCXX_STANDARD) {
    if (value) {
      this->impl->LanguageStandardProperties[prop] =
        BTs<std::string>(value, this->impl->Makefile->GetBacktrace());
    } else {
      this->impl->LanguageStandardProperties.erase(prop);
    }
  } else if (this->impl->HeadersFileSets.WriteProperties(
               this, this->impl.get(), prop, value, true)) {
    /* Handled in the `if` condition. */
  } else if (this->impl->CxxModulesFileSets.WriteProperties(
               this, this->impl.get(), prop, value, true)) {
    /* Handled in the `if` condition. */
  } else if (this->impl->CxxModuleHeadersFileSets.WriteProperties(
               this, this->impl.get(), prop, value, true)) {
    /* Handled in the `if` condition. */
  } else {
    this->impl->Properties.SetProperty(prop, value);
  }
}